

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# x_pigpio.c
# Opt level: O1

void t5(void)

{
  int iVar1;
  undefined4 uVar2;
  uint uVar3;
  int iVar4;
  int got;
  gpioPulse_t wf [4];
  char text [2048];
  undefined8 local_848;
  undefined8 uStack_840;
  undefined8 local_838;
  undefined8 uStack_830;
  undefined8 local_828;
  undefined8 uStack_820;
  char local_818 [2056];
  
  local_828 = 60000;
  uStack_820 = 0x186a002000000;
  local_838 = 0x753002000000;
  uStack_830 = 0x2000000;
  local_848 = 0x2000000;
  uStack_840 = 10000;
  puts("Waveforms & serial read/write tests.");
  t5_count = 0;
  gpioSetAlertFunc(0x19,t5cbf);
  gpioSetMode(0x19,1);
  iVar1 = gpioWaveClear();
  CHECK(5,1,iVar1,0,0,"callback, set mode, wave clear");
  iVar1 = gpioWaveAddGeneric(4,&local_848);
  CHECK(5,2,iVar1,4,0,"pulse, wave add generic");
  uVar2 = gpioWaveCreate();
  iVar1 = gpioWaveTxSend(uVar2,1);
  iVar4 = 0x13;
  if (iVar1 < 0xe) {
    iVar4 = 9;
  }
  CHECK(5,3,iVar1,iVar4,0,"wave tx repeat");
  iVar1 = t5_count;
  time_sleep(0);
  CHECK(5,4,t5_count - iVar1,0x32,1,"callback");
  iVar1 = gpioWaveTxStop();
  CHECK(5,5,iVar1,0,0,"wave tx stop");
  iVar1 = gpioSerialReadOpen(0x19,0x12c0,8);
  CHECK(5,6,iVar1,0,0,"serial read open");
  gpioWaveClear();
  iVar1 = gpioWaveAddSerial(0x19,0x12c0,8,2,5000000,0x22c,
                            "\nNow is the winter of our discontent\nMade glorious summer by this sun of York;\nAnd all the clouds that lour\'d upon our house\nIn the deep bosom of the ocean buried.\nNow are our brows bound with victorious wreaths;\nOur bruised arms hung up for monuments;\nOur stern alarums changed to merry meetings,\nOur dreadful marches to delightful measures.\nGrim-visaged war hath smooth\'d his wrinkled front;\nAnd now, instead of mounting barded steeds\nTo fright the souls of fearful adversaries,\nHe capers nimbly in a lady\'s chamber\nTo the lascivious pleasing of a lute.\n"
                           );
  CHECK(5,7,iVar1,0xd4d,0,"wave clear, wave add serial");
  uVar2 = gpioWaveCreate();
  iVar1 = gpioWaveTxSend(uVar2,0);
  iVar4 = 0x1bcc;
  if (iVar1 < 0x1b34) {
    iVar4 = 0x1a9b;
  }
  CHECK(5,8,iVar1,iVar4,0,"wave tx start");
  printf("TEST %2d.%-2d PASS (%s: %d)\n",5,9,"NOT APPLICABLE");
  printf("TEST %2d.%-2d PASS (%s: %d)\n",5,10);
  while( true ) {
    iVar1 = gpioWaveTxBusy();
    if (iVar1 == 0) break;
    time_sleep(0x9999999a);
  }
  time_sleep(0x9999999a);
  uVar3 = gpioSerialRead(0x19,local_818,0x7ff);
  if (0 < (int)uVar3) {
    local_818[uVar3] = '\0';
  }
  iVar1 = strcmp("\nNow is the winter of our discontent\nMade glorious summer by this sun of York;\nAnd all the clouds that lour\'d upon our house\nIn the deep bosom of the ocean buried.\nNow are our brows bound with victorious wreaths;\nOur bruised arms hung up for monuments;\nOur stern alarums changed to merry meetings,\nOur dreadful marches to delightful measures.\nGrim-visaged war hath smooth\'d his wrinkled front;\nAnd now, instead of mounting barded steeds\nTo fright the souls of fearful adversaries,\nHe capers nimbly in a lady\'s chamber\nTo the lascivious pleasing of a lute.\n"
                 ,local_818);
  CHECK(5,0xb,iVar1,0,0,"wave tx busy, serial read");
  iVar4 = gpioSerialReadClose(0x19);
  CHECK(5,0xc,iVar4,0,0,"serial read close");
  iVar1 = gpioWaveGetMicros();
  CHECK(5,0xd,iVar1,0x5df744,0,"wave get micros");
  iVar1 = gpioWaveGetHighMicros();
  CHECK(5,0xe,iVar1,0x5df744,0,"wave get high micros");
  iVar1 = gpioWaveGetMaxMicros();
  CHECK(5,0xf,iVar1,1800000000,0,"wave get max micros");
  iVar1 = gpioWaveGetPulses();
  CHECK(5,0x10,iVar1,0xd4d,0,"wave get pulses");
  iVar1 = gpioWaveGetHighPulses();
  CHECK(5,0x11,iVar1,0xd4d,0,"wave get high pulses");
  iVar1 = gpioWaveGetMaxPulses();
  CHECK(5,0x12,iVar1,12000,0,"wave get max pulses");
  got = gpioWaveGetCbs();
  iVar1 = 0x1bcb;
  if (iVar4 < 0x1b33) {
    iVar1 = 0x1a9a;
  }
  CHECK(5,0x13,got,iVar1,0,"wave get cbs");
  iVar4 = gpioWaveGetHighCbs();
  CHECK(5,0x14,iVar4,iVar1,0,"wave get high cbs");
  iVar1 = gpioWaveGetMaxCbs();
  CHECK(5,0x15,iVar1,0x61b8,0,"wave get max cbs");
  return;
}

Assistant:

void t5()
{
   int BAUD=4800;

   char *TEXT=
"\n\
Now is the winter of our discontent\n\
Made glorious summer by this sun of York;\n\
And all the clouds that lour'd upon our house\n\
In the deep bosom of the ocean buried.\n\
Now are our brows bound with victorious wreaths;\n\
Our bruised arms hung up for monuments;\n\
Our stern alarums changed to merry meetings,\n\
Our dreadful marches to delightful measures.\n\
Grim-visaged war hath smooth'd his wrinkled front;\n\
And now, instead of mounting barded steeds\n\
To fright the souls of fearful adversaries,\n\
He capers nimbly in a lady's chamber\n\
To the lascivious pleasing of a lute.\n\
";

   gpioPulse_t wf[] =
   {
      {1<<GPIO, 0,  10000},
      {0, 1<<GPIO,  30000},
      {1<<GPIO, 0,  60000},
      {0, 1<<GPIO, 100000},
   };

   int e, oc, c, wid;

   char text[2048];

   printf("Waveforms & serial read/write tests.\n");

   t5_count = 0;

   gpioSetAlertFunc(GPIO, t5cbf);

   gpioSetMode(GPIO, PI_OUTPUT);

   e = gpioWaveClear();
   CHECK(5, 1, e, 0, 0, "callback, set mode, wave clear");

   e = gpioWaveAddGeneric(4, wf);
   CHECK(5, 2, e, 4, 0, "pulse, wave add generic");

   wid = gpioWaveCreate();
   e = gpioWaveTxSend(wid, PI_WAVE_MODE_REPEAT);
   if (e < 14) CHECK(5, 3, e,  9, 0, "wave tx repeat");
   else        CHECK(5, 3, e, 19, 0, "wave tx repeat");

   oc = t5_count;
   time_sleep(5);
   c = t5_count - oc;
   CHECK(5, 4, c, 50, 1, "callback");

   e = gpioWaveTxStop();
   CHECK(5, 5, e, 0, 0, "wave tx stop");

   /* gpioSerialReadOpen changes the alert function */

   e = gpioSerialReadOpen(GPIO, BAUD, 8);
   CHECK(5, 6, e, 0, 0, "serial read open");

   gpioWaveClear();
   e = gpioWaveAddSerial(GPIO, BAUD, 8, 2, 5000000, strlen(TEXT), TEXT);
   CHECK(5, 7, e, 3405, 0, "wave clear, wave add serial");

   wid = gpioWaveCreate();
   e = gpioWaveTxSend(wid, PI_WAVE_MODE_ONE_SHOT);
   if (e < 6964) CHECK(5, 8, e, 6811, 0, "wave tx start");
   else          CHECK(5, 8, e, 7116, 0, "wave tx start");

   CHECK(5, 9, 0, 0, 0, "NOT APPLICABLE");

   CHECK(5, 10, 0, 0, 0, "NOT APPLICABLE");

   while (gpioWaveTxBusy()) time_sleep(0.1);
   time_sleep(0.1);
   c = gpioSerialRead(GPIO, text, sizeof(text)-1);
   if (c > 0) text[c] = 0;
   CHECK(5, 11, strcmp(TEXT, text), 0, 0, "wave tx busy, serial read");

   e = gpioSerialReadClose(GPIO);
   CHECK(5, 12, e, 0, 0, "serial read close");

   c = gpioWaveGetMicros();
   CHECK(5, 13, c, 6158148, 0, "wave get micros");

   c = gpioWaveGetHighMicros();
   CHECK(5, 14, c, 6158148, 0, "wave get high micros");

   c = gpioWaveGetMaxMicros();
   CHECK(5, 15, c, 1800000000, 0, "wave get max micros");

   c = gpioWaveGetPulses();
   CHECK(5, 16, c, 3405, 0, "wave get pulses");

   c = gpioWaveGetHighPulses();
   CHECK(5, 17, c, 3405, 0, "wave get high pulses");

   c = gpioWaveGetMaxPulses();
   CHECK(5, 18, c, 12000, 0, "wave get max pulses");

   c = gpioWaveGetCbs();
   if (e < 6963) CHECK(5, 19, c, 6810, 0, "wave get cbs");
   else          CHECK(5, 19, c, 7115, 0, "wave get cbs");

   c = gpioWaveGetHighCbs();
   if (e < 6963) CHECK(5, 20, c, 6810, 0, "wave get high cbs");
   else          CHECK(5, 20, c, 7115, 0, "wave get high cbs");

   c = gpioWaveGetMaxCbs();
   CHECK(5, 21, c, 25016, 0, "wave get max cbs");
}